

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Collision_PDU::Collision_PDU(Collision_PDU *this,Header *H,KDataStream *stream)

{
  KUINT8 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Header6_00227000;
  KVar1 = (H->super_Header6).m_ui8ExerciseID;
  KVar2 = (H->super_Header6).m_ui8PDUType;
  KVar3 = (H->super_Header6).m_ui8ProtocolFamily;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = (H->super_Header6).m_ui8ProtocolVersion;
  (this->super_Header).super_Header6.m_ui8ExerciseID = KVar1;
  (this->super_Header).super_Header6.m_ui8PDUType = KVar2;
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = KVar3;
  (this->super_Header).super_Header6.m_TimeStamp.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__TimeStamp_00223e80;
  (this->super_Header).super_Header6.m_TimeStamp.m_TimeStampUnion =
       (H->super_Header6).m_TimeStamp.m_TimeStampUnion;
  (this->super_Header).super_Header6.m_TimeStamp.m_bAutoCalcRel =
       (H->super_Header6).m_TimeStamp.m_bAutoCalcRel;
  KVar1 = (H->super_Header6).m_ui8Padding1;
  KVar2 = (H->super_Header6).m_ui8Padding2;
  (this->super_Header).super_Header6.m_ui16PDULength = (H->super_Header6).m_ui16PDULength;
  (this->super_Header).super_Header6.m_ui8Padding1 = KVar1;
  (this->super_Header).super_Header6.m_ui8Padding2 = KVar2;
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Header7_00227390;
  (this->super_Header).super_Header6.field_0x26 = (H->super_Header6).field_0x26;
  *(undefined2 *)&(this->super_Header).super_Header6.field_0x24 =
       *(undefined2 *)&(H->super_Header6).field_0x24;
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Collision_PDU_00229d58;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_IssuingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_CollidingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EventID);
  DATA_TYPE::Vector::Vector(&this->m_Velocity);
  DATA_TYPE::Vector::Vector(&this->m_Location);
  (*(this->super_Header).super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

Collision_PDU::Collision_PDU(const Header &H, KDataStream &stream) noexcept(false) :
    Header( H )
{
    Decode( stream, true );
}